

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generateList.hpp
# Opt level: O3

vector<double,_std::allocator<double>_> *
njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle::LegendreCoefficients::generateList
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,uint na,
          vector<double,_std::allocator<double>_> *energies,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *coefficients)

{
  pointer pvVar1;
  undefined8 *puVar2;
  unsigned_long args_1;
  char *args;
  pointer pvVar3;
  
  pvVar3 = (coefficients->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (coefficients->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if ((long)(energies->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(energies->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start >> 3 !=
      ((long)pvVar1 - (long)pvVar3 >> 3) * -0x5555555555555555) {
    tools::Log::error<char_const*>
              ("The number of energies and number of sets if coefficients must be the same");
    tools::Log::info<char_const*,unsigned_long>
              ("Number of energies: {}",
               (long)(energies->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(energies->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 3);
    args_1 = ((long)(coefficients->
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(coefficients->
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    args = "Number of coefficient sets: {}";
LAB_0012fae5:
    tools::Log::info<char_const*,unsigned_long>(args,args_1);
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar2 = getenv;
    __cxa_throw(puVar2,&std::exception::typeinfo,std::exception::~exception);
  }
  if (pvVar3 != pvVar1) {
    do {
      if ((long)(pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3 != (ulong)(na + 1)) {
        tools::Log::error<char_const*>
                  ("The number of coefficients for each energy value must be the same");
        tools::Log::info<char_const*,unsigned_int>("Expected: {}",na + 1);
        args_1 = (long)(pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start >> 3;
        args = "Found: {}";
        goto LAB_0012fae5;
      }
      pvVar3 = pvVar3 + 1;
    } while (pvVar3 != pvVar1);
  }
  ranges::detail::to_container::fn<meta::id<std::vector<double,std::allocator<double>>>>::
  impl<std::vector<double,std::allocator<double>>,ranges::common_iterator<ranges::basic_iterator<ranges::join_view<ranges::zip_with_view<ranges::views::concat_fn,ranges::transform_view<ranges::ref_view<std::vector<double,std::allocator<double>>>,ranges::views::single_fn>,ranges::ref_view<std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>>>::cursor<false>>,ranges::default_sentinel_t>,ranges::join_view<ranges::zip_with_view<ranges::views::concat_fn,ranges::transform_view<ranges::ref_view<std::vector<double,std::allocator<double>>>,ranges::views::single_fn>,ranges::ref_view<std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>>>>
            (__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

static std::vector< double >
generateList( unsigned int na,
              std::vector< double >&& energies,
              std::vector< std::vector< double > >&& coefficients ) {

  if ( energies.size() != coefficients.size() ) {

    Log::error( "The number of energies and number of sets if coefficients "
                "must be the same" );
    Log::info( "Number of energies: {}", energies.size() );
    Log::info( "Number of coefficient sets: {}", coefficients.size() );
    throw std::exception();
  }

  for ( auto& entry : coefficients ) {

    if ( 1 + na != entry.size() ) {

      Log::error( "The number of coefficients for each energy value must "
                  "be the same" );
      Log::info( "Expected: {}", 1 + na );
      Log::info( "Found: {}", entry.size() );
      throw std::exception();
    }
  }

  return ranges::to< std::vector< double > >(
           ranges::views::zip_with(
             ranges::views::concat,
             energies | ranges::cpp20::views::transform(
                            ranges::cpp20::views::single ),
             coefficients ) | ranges::views::join );
}